

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Lms_GiaProfilesPrint(Gia_Man_t *p)

{
  char cVar1;
  uint uVar2;
  Vec_Wrd_t *p_00;
  Vec_Str_t *p_01;
  Gia_Obj_t *pGVar3;
  word D;
  uint v;
  int v_00;
  int iVar4;
  
  p_00 = Lms_GiaDelays(p);
  p_01 = Lms_GiaAreas(p);
  for (v = 0; (int)v < p->vCos->nSize - p->nRegs; v = v + 1) {
    pGVar3 = Gia_ManCo(p,v);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    v_00 = 0;
    printf("%6d : ",(ulong)v);
    cVar1 = Vec_StrEntry(p_01,v);
    printf("A = %2d  ",(ulong)(uint)(int)cVar1);
    D = Vec_WrdEntry(p_00,v);
    iVar4 = p->vCis->nSize - p->nRegs;
    printf("Delay profile = {");
    if (iVar4 < 1) {
      iVar4 = v_00;
    }
    for (; iVar4 != v_00; v_00 = v_00 + 1) {
      uVar2 = Lms_DelayGet(D,v_00);
      printf(" %d",(ulong)uVar2);
    }
    puts(" }");
  }
  Vec_WrdFree(p_00);
  Vec_StrFree(p_01);
  return;
}

Assistant:

void Lms_GiaProfilesPrint( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_Wrd_t * vDelays;
    Vec_Str_t * vAreas;
    vDelays = Lms_GiaDelays( p );
    vAreas = Lms_GiaAreas( p );
    Gia_ManForEachPo( p, pObj, i )
    {
        printf( "%6d : ", i );
        printf( "A = %2d  ", Vec_StrEntry(vAreas, i) );
        Lms_DelayPrint( Vec_WrdEntry(vDelays, i), Gia_ManPiNum(p) );
//        Lms_GiaPrintSubgraph( p, pObj );
//        printf( "\n" );
    }
    Vec_WrdFree( vDelays );
    Vec_StrFree( vAreas );
}